

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O1

bool duckdb::StringEnumCast<unsigned_int>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  string_t *source_data;
  uint *result_data;
  SelectionVector *sel;
  data_ptr_t source_data_00;
  bool bVar1;
  VectorTryCastData vector_cast_data;
  UnifiedVectorFormat vdata;
  VectorTryCastData vector_cast_data_1;
  
  if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    source_data = (string_t *)source->data;
    vdata.sel = (SelectionVector *)
                (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    vdata.data = (data_ptr_t)
                 (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
    vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask)->_M_use_count
             + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask)->_M_use_count
             + 1;
      }
    }
    vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(source->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
    vector_cast_data.all_converted = true;
    vector_cast_data.result = result;
    vector_cast_data.parameters = parameters;
    bVar1 = StringEnumCastLoop<unsigned_int>
                      (source_data,(ValidityMask *)&vdata,&source->type,(uint *)result->data,
                       &result->validity,&result->type,1,&vector_cast_data,(SelectionVector *)0x0);
    vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
    Vector::ToUnifiedFormat(source,count,&vdata);
    Vector::SetVectorType(result,FLAT_VECTOR);
    source_data_00 = vdata.data;
    sel = vdata.sel;
    vector_cast_data.result =
         (Vector *)vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
    vector_cast_data.parameters =
         (CastParameters *)
         vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    vector_cast_data._16_8_ =
         vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    result_data = (uint *)result->data;
    FlatVector::VerifyFlatVector(result);
    vector_cast_data_1.all_converted = true;
    vector_cast_data_1.result = result;
    vector_cast_data_1.parameters = parameters;
    bVar1 = StringEnumCastLoop<unsigned_int>
                      ((string_t *)source_data_00,(ValidityMask *)&vector_cast_data,&source->type,
                       result_data,&result->validity,&result->type,count,&vector_cast_data_1,sel);
    if (vector_cast_data._16_8_ != 0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vector_cast_data._16_8_);
    }
    if (vdata.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (vdata.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

bool StringEnumCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	D_ASSERT(source.GetType().id() == LogicalTypeId::VARCHAR);
	switch (source.GetVectorType()) {
	case VectorType::CONSTANT_VECTOR: {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto source_data = ConstantVector::GetData<string_t>(source);
		auto source_mask = ConstantVector::Validity(source);
		auto result_data = ConstantVector::GetData<T>(result);
		auto &result_mask = ConstantVector::Validity(result);

		VectorTryCastData vector_cast_data(result, parameters);
		return StringEnumCastLoop(source_data, source_mask, source.GetType(), result_data, result_mask,
		                          result.GetType(), 1, vector_cast_data, nullptr);
	}
	default: {
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);

		auto source_data = UnifiedVectorFormat::GetData<string_t>(vdata);
		auto source_sel = vdata.sel;
		auto source_mask = vdata.validity;
		auto result_data = FlatVector::GetData<T>(result);
		auto &result_mask = FlatVector::Validity(result);

		VectorTryCastData vector_cast_data(result, parameters);
		return StringEnumCastLoop(source_data, source_mask, source.GetType(), result_data, result_mask,
		                          result.GetType(), count, vector_cast_data, source_sel);
	}
	}
}